

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O2

void flatbuffers::anon_unknown_94::CopyInline
               (FlatBufferBuilder *fbb,Field *fielddef,Table *table,size_t align,size_t size)

{
  uint16_t uVar1;
  uchar *bytes;
  
  FlatBufferBuilderImpl<false>::Align(fbb,align);
  uVar1 = reflection::Field::offset(fielddef);
  bytes = Table::GetStruct<unsigned_char_const*>(table,uVar1);
  vector_downward<unsigned_int>::push(&fbb->buf_,bytes,size);
  uVar1 = reflection::Field::offset(fielddef);
  FlatBufferBuilderImpl<false>::TrackField(fbb,uVar1,(fbb->buf_).size_);
  return;
}

Assistant:

static void CopyInline(FlatBufferBuilder &fbb,
                       const reflection::Field &fielddef, const Table &table,
                       size_t align, size_t size) {
  fbb.Align(align);
  fbb.PushBytes(table.GetStruct<const uint8_t *>(fielddef.offset()), size);
  fbb.TrackField(fielddef.offset(), fbb.GetSize());
}